

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall TCLAP::CmdLine::xorAdd(CmdLine *this,Arg *a,Arg *b)

{
  value_type local_58 [3];
  Arg *local_40;
  undefined1 local_38 [8];
  vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> ors;
  Arg *b_local;
  Arg *a_local;
  CmdLine *this_local;
  
  ors.super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)b;
  std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::vector
            ((vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38);
  local_40 = a;
  std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::push_back
            ((vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38,&local_40);
  local_58[0] = (value_type)
                ors.super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::push_back
            ((vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38,local_58);
  (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[5])(this,local_38);
  std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::~vector
            ((vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)local_38);
  return;
}

Assistant:

inline void CmdLine::xorAdd( Arg& a, Arg& b )
{
	std::vector<Arg*> ors;
	ors.push_back( &a );
	ors.push_back( &b );
	xorAdd( ors );
}